

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv4_prefix.c
# Opt level: O2

void ipv4prefix_zero_host(in_addr *addr,uint8_t prefix)

{
  uint uVar1;
  uint uVar2;
  undefined3 in_register_00000031;
  
  uVar1 = 0;
  for (uVar2 = 0; uVar2 != 0x20; uVar2 = uVar2 + 1) {
    uVar1 = (uint)(uVar2 < CONCAT31(in_register_00000031,prefix)) + uVar1 * 2;
  }
  addr->s_addr = addr->s_addr &
                 (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
  return;
}

Assistant:

static void
ipv4prefix_zero_host(struct in_addr *addr, uint8_t prefix)
{
    uint32_t i, mask;

    /* zero host bits */
    mask = 0;
    for (i = 0; i < 32; ++i) {
        mask <<= 1;
        if (prefix > i) {
            mask |= 1;
        }
    }
    mask = htonl(mask);
    addr->s_addr &= mask;
}